

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O3

void bn_mont_reduction_u32(uint32_t len,uint32_t *n,uint32_t nInv,uint32_t *c,uint32_t *res)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 in_register_0000003c;
  uint32_t *puVar12;
  ulong uVar13;
  uint32_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  void *__s;
  ulong uVar17;
  bool bVar18;
  int iStack_74;
  undefined8 uStack_70;
  uint32_t *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  uint32_t *local_48;
  uint32_t local_3c;
  ulong local_38;
  
  local_50 = CONCAT44(in_register_0000003c,len);
  if (len == 0) {
    uVar11 = 0;
    uVar17 = 0;
    local_38 = local_38 & 0xffffffff00000000;
  }
  else {
    uVar11 = (ulong)(len >> 2);
    uVar17 = (ulong)len;
    local_68 = c + uVar17;
    local_60 = (ulong)(len & 0xfffffffc);
    puVar12 = c + 3;
    uVar13 = 0;
    bVar18 = false;
    puVar14 = c;
    do {
      uVar6 = (ulong)(c[uVar13] * nInv);
      uVar15 = 0;
      if (3 < len) {
        lVar9 = 0;
        uVar15 = 0;
        do {
          uVar15 = *(uint *)((long)n + lVar9) * uVar6 +
                   *(uint *)((long)puVar12 + lVar9 + -0xc) + uVar15;
          *(int *)((long)puVar12 + lVar9 + -0xc) = (int)uVar15;
          uVar15 = *(uint *)((long)n + lVar9 + 4) * uVar6 +
                   (ulong)*(uint *)((long)puVar12 + lVar9 + -8) + (uVar15 >> 0x20);
          *(int *)((long)puVar12 + lVar9 + -8) = (int)uVar15;
          uVar15 = *(uint *)((long)n + lVar9 + 8) * uVar6 +
                   (ulong)*(uint *)((long)puVar12 + lVar9 + -4) + (uVar15 >> 0x20);
          *(int *)((long)puVar12 + lVar9 + -4) = (int)uVar15;
          uVar15 = *(uint *)((long)n + lVar9 + 0xc) * uVar6 +
                   (ulong)*(uint *)((long)puVar12 + lVar9) + (uVar15 >> 0x20);
          *(int *)((long)puVar12 + lVar9) = (int)uVar15;
          uVar15 = uVar15 >> 0x20;
          lVar9 = lVar9 + 0x10;
        } while (uVar11 << 4 != lVar9);
      }
      uVar8 = (uint)uVar15;
      uVar10 = local_60;
      if ((len & 3) != 0) {
        do {
          uVar16 = uVar15 + puVar14[uVar10] + n[uVar10] * uVar6;
          puVar14[uVar10] = (uint32_t)uVar16;
          uVar15 = uVar16 >> 0x20;
          uVar8 = (uint)(uVar16 >> 0x20);
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar17);
      }
      uVar2 = (uint)bVar18;
      uVar3 = uVar8 + c[(int)uVar13 + len];
      bVar18 = CARRY4(uVar8,c[(int)uVar13 + len]) || CARRY4(uVar3,uVar2);
      local_68[uVar13] = uVar3 + uVar2;
      uVar13 = uVar13 + 1;
      puVar12 = puVar12 + 1;
      puVar14 = puVar14 + 1;
    } while (uVar13 != uVar17);
    local_38 = (ulong)bVar18;
    local_58 = uVar11;
    local_3c = nInv;
  }
  uStack_70 = 0x132b60;
  local_48 = res;
  memcpy(res,c + uVar17,uVar17 * 4);
  lVar9 = -(uVar17 * 4 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_68 + lVar9);
  *(undefined8 *)((long)&uStack_70 + lVar9) = 0x132b82;
  memset(__s,0,uVar17 * 4);
  uVar8 = 0;
  if (3 < (uint)local_50) {
    lVar7 = 0xc;
    bVar18 = false;
    do {
      uVar8 = *(uint *)((long)local_48 + lVar7 + -0xc);
      puVar1 = (uint *)((long)n + lVar7 + -0xc);
      uVar2 = *puVar1;
      uVar4 = uVar8 - *puVar1;
      *(uint *)((long)&iStack_74 + lVar7 + lVar9) = uVar4 - bVar18;
      uVar3 = *(uint *)((long)local_48 + lVar7 + -8);
      puVar1 = (uint *)((long)n + lVar7 + -8);
      uVar4 = (uint)(uVar8 < uVar2 || uVar4 < bVar18);
      uVar8 = *puVar1;
      uVar5 = uVar3 - *puVar1;
      *(uint *)((long)&uStack_70 + lVar7 + lVar9) = uVar5 - uVar4;
      uVar2 = *(uint *)((long)local_48 + lVar7 + -4);
      puVar1 = (uint *)((long)n + lVar7 + -4);
      uVar3 = (uint)(uVar3 < uVar8 || uVar5 < uVar4);
      uVar8 = *puVar1;
      uVar4 = uVar2 - *puVar1;
      *(uint *)((long)&uStack_70 + lVar7 + lVar9 + 4) = uVar4 - uVar3;
      uVar8 = (uint)(uVar2 < uVar8 || uVar4 < uVar3);
      uVar2 = *(uint *)((long)local_48 + lVar7) - *(uint *)((long)n + lVar7);
      bVar18 = *(uint *)((long)local_48 + lVar7) < *(uint *)((long)n + lVar7) || uVar2 < uVar8;
      *(uint *)((long)__s + lVar7) = uVar2 - uVar8;
      lVar7 = lVar7 + 0x10;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    uVar8 = (uint)bVar18;
  }
  if ((local_50 & 3) != 0) {
    uVar11 = (ulong)((uint)uVar17 & 0xfffffffc);
    do {
      uVar2 = (uint)((char)uVar8 != '\0');
      uVar3 = local_48[uVar11] - n[uVar11];
      bVar18 = local_48[uVar11] < n[uVar11] || uVar3 < uVar2;
      uVar8 = (uint)bVar18;
      *(uint *)((long)__s + uVar11 * 4) = uVar3 - uVar2;
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar17);
    uVar8 = (uint)bVar18;
  }
  if ((uint)local_50 != 0) {
    uVar11 = 0;
    do {
      local_48[uVar11] =
           *(uint *)((long)__s + uVar11 * 4) & ~((int)local_38 - uVar8) |
           local_48[uVar11] & (int)local_38 - uVar8;
      uVar11 = uVar11 + 1;
    } while (uVar17 != uVar11);
  }
  return;
}

Assistant:

static void
bn_mont_reduction_u32(uint32_t len, uint32_t *n, uint32_t nInv, uint32_t *c, uint32_t *res)
{
  uint32_t c0 = 0U;
  for (uint32_t i0 = 0U; i0 < len; i0++)
  {
    uint32_t qj = nInv * c[i0];
    uint32_t *res_j0 = c + i0;
    uint32_t c1 = 0U;
    for (uint32_t i = 0U; i < len / 4U; i++)
    {
      uint32_t a_i = n[4U * i];
      uint32_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i0);
      uint32_t a_i0 = n[4U * i + 1U];
      uint32_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, qj, c1, res_i1);
      uint32_t a_i1 = n[4U * i + 2U];
      uint32_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, qj, c1, res_i2);
      uint32_t a_i2 = n[4U * i + 3U];
      uint32_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, qj, c1, res_i);
    }
    for (uint32_t i = len / 4U * 4U; i < len; i++)
    {
      uint32_t a_i = n[i];
      uint32_t *res_i = res_j0 + i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i);
    }
    uint32_t r = c1;
    uint32_t c10 = r;
    uint32_t *resb = c + len + i0;
    uint32_t res_j = c[len + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, c10, res_j, resb);
  }
  memcpy(res, c + len, (len + len - len) * sizeof (uint32_t));
  uint32_t c00 = c0;
  KRML_CHECK_SIZE(sizeof (uint32_t), len);
  uint32_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint32_t));
  uint32_t c1 = 0U;
  for (uint32_t i = 0U; i < len / 4U; i++)
  {
    uint32_t t1 = res[4U * i];
    uint32_t t20 = n[4U * i];
    uint32_t *res_i0 = tmp + 4U * i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t1, t20, res_i0);
    uint32_t t10 = res[4U * i + 1U];
    uint32_t t21 = n[4U * i + 1U];
    uint32_t *res_i1 = tmp + 4U * i + 1U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t10, t21, res_i1);
    uint32_t t11 = res[4U * i + 2U];
    uint32_t t22 = n[4U * i + 2U];
    uint32_t *res_i2 = tmp + 4U * i + 2U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t11, t22, res_i2);
    uint32_t t12 = res[4U * i + 3U];
    uint32_t t2 = n[4U * i + 3U];
    uint32_t *res_i = tmp + 4U * i + 3U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t12, t2, res_i);
  }
  for (uint32_t i = len / 4U * 4U; i < len; i++)
  {
    uint32_t t1 = res[i];
    uint32_t t2 = n[i];
    uint32_t *res_i = tmp + i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t1, t2, res_i);
  }
  uint32_t c10 = c1;
  uint32_t c2 = c00 - c10;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint32_t *os = res;
    uint32_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;
  }
}